

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::ElementU
          (ByteCodeWriter *this,OpCode op,RegSlot instance,PropertyIdIndexType index)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_20;
  PropertyIdIndexType PStack_1c;
  bool success;
  RegSlot local_18;
  PropertyIdIndexType index_local;
  RegSlot instance_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  PStack_1c = index;
  local_18 = instance;
  index_local._2_2_ = op;
  _instance_local = this;
  CheckOpen(this);
  op_00 = index_local._2_2_;
  OpLayoutType::OpLayoutType(&local_20,ElementU);
  CheckOp(this,op_00,local_20);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(index_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x727,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_18 = ConsumeReg(this,local_18);
  bVar2 = TryWriteElementU<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,index_local._2_2_,local_18,PStack_1c);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,index_local._2_2_,local_18,PStack_1c), !bVar2)) &&
     (bVar2 = TryWriteElementU<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,index_local._2_2_,local_18,PStack_1c), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x72b,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::ElementU(OpCode op, RegSlot instance, PropertyIdIndexType index)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementU);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        instance = ConsumeReg(instance);

        MULTISIZE_LAYOUT_WRITE(ElementU, op, instance, index);
    }